

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O1

bool __thiscall MathInterpreter::isVariable(MathInterpreter *this,string *s)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  pbVar2 = (byte *)(s->_M_dataplus)._M_p;
  if ((byte)((*pbVar2 & 0xdf) + 0xbf) < 0x1a) {
    uVar3 = s->_M_string_length;
    uVar5 = 1;
    if (1 < uVar3) {
      uVar6 = 2;
      do {
        bVar1 = pbVar2[uVar5];
        if ((((0x19 < (byte)(bVar1 + 0x9f)) && (9 < (byte)(bVar1 - 0x30))) && (bVar1 != 0x5f)) &&
           (0x19 < (byte)(bVar1 + 0xbf))) break;
        bVar4 = uVar6 < uVar3;
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar4);
    }
    if (uVar3 == uVar5) {
      return true;
    }
  }
  return false;
}

Assistant:

bool MathInterpreter::isVariable(string s) {
  unsigned int i = 0;
  std::size_t size = s.size();
  if (((s[i] <= 'z') && (s[i] >= 'a')) || ((s[i] <= 'Z') && (s[i] >= 'A'))) {
    i++;
    while (i < size && (((s[i] <= 'z') && (s[i] >= 'a'))
        || ((s[i] <= 'Z') && (s[i] >= 'A')) || (s[i] == '_')
        || ((s[i] <= '9') && (s[i] >= '0')))) {
      i++;
    }
    if (i == size) {
      return true;
    }
  }
  return false;
}